

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::BaseAssembler::comment(BaseAssembler *this,char *data,size_t size)

{
  EmitterFlags EVar1;
  Logger *pLVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  Error EVar5;
  CodeHolder *code;
  BaseEmitter *this_00;
  BaseEmitter *this_01;
  
  EVar1 = (this->super_BaseEmitter)._emitterFlags;
  if ((EVar1 & kLogComments) == kNone) {
    if ((EVar1 & kAttached) == kNone) {
      EVar5 = BaseEmitter::reportError(&this->super_BaseEmitter,5,(char *)0x0);
      return EVar5;
    }
  }
  else {
    this_00 = (BaseEmitter *)(this->super_BaseEmitter)._logger;
    if (this_00 == (BaseEmitter *)0x0) {
      comment();
      code = (CodeHolder *)data;
      this_01 = this_00;
      EVar5 = BaseEmitter::onAttach(this_00,(CodeHolder *)data);
      if (EVar5 == 0) {
        if (*(int *)&((CodeHolder *)data)->field_0xe0 == 0) {
          onAttach();
          *(undefined8 *)&this_01[1]._diagnosticOptions = 0;
          this_01[1]._archMask = 0;
          this_01[1]._vptr_BaseEmitter = (_func_int **)0x0;
          this_01[1]._emitterType = kNone;
          this_01[1]._emitterFlags = kNone;
          this_01[1]._instructionAlignment = '\0';
          this_01[1]._reservedBaseEmitter = '\0';
          this_01[1]._validationFlags = kNone;
          EVar5 = BaseEmitter::onDetach(this_01,code);
          return EVar5;
        }
        pp_Var3 = (_func_int **)**(long **)&((CodeHolder *)data)->_sections;
        p_Var4 = pp_Var3[9];
        this_00[1]._vptr_BaseEmitter = pp_Var3;
        *(_func_int **)&this_00[1]._emitterType = p_Var4;
        this_00[1]._archMask = (uint64_t)(pp_Var3[10] + (long)p_Var4);
        *(_func_int **)&this_00[1]._diagnosticOptions = p_Var4 + (long)pp_Var3[0xb];
      }
      return EVar5;
    }
    (*this_00->_vptr_BaseEmitter[2])();
    pLVar2 = (this->super_BaseEmitter)._logger;
    (*pLVar2->_vptr_Logger[2])(pLVar2,"\n",1);
  }
  return 0;
}

Assistant:

Error BaseAssembler::comment(const char* data, size_t size) {
  if (!hasEmitterFlag(EmitterFlags::kLogComments)) {
    if (!hasEmitterFlag(EmitterFlags::kAttached))
      return reportError(DebugUtils::errored(kErrorNotInitialized));
    return kErrorOk;
  }

#ifndef ASMJIT_NO_LOGGING
  // Logger cannot be NULL if `EmitterFlags::kLogComments` is set.
  ASMJIT_ASSERT(_logger != nullptr);

  _logger->log(data, size);
  _logger->log("\n", 1);
  return kErrorOk;
#else
  DebugUtils::unused(data, size);
  return kErrorOk;
#endif
}